

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

Error * ot::commissioner::utils::Hex(Error *__return_storage_ptr__,ByteArray *aBuf,string *aHexStr)

{
  char cVar1;
  pointer pcVar2;
  uint8_t uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_50;
  
  uVar6 = aHexStr->_M_string_length;
  if ((uVar6 & 1) == 0) {
    for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 2) {
      pcVar2 = (aHexStr->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar9];
      iVar5 = isxdigit((int)cVar1);
      if ((iVar5 == 0) || (iVar5 = isxdigit((int)pcVar2[uVar9 + 1]), iVar5 == 0)) {
        local_88.types_[0] = string_type;
        local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "{} is not a valid HEX string; there is non-HEX char";
        local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
        local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_88.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar8 = "{} is not a valid HEX string; there is non-HEX char";
        write.handler_ = &local_88;
        local_88.context_.types_ = local_88.types_;
        while (pcVar8 != "") {
          cVar1 = *pcVar8;
          pcVar7 = pcVar8;
          while (cVar1 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&write,pcVar8,"");
              goto LAB_0017c8fb;
            }
            cVar1 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar8,pcVar7);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar7,"",&local_88);
        }
LAB_0017c8fb:
        local_88._0_8_ = (aHexStr->_M_dataplus)._M_p;
        local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)aHexStr->_M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x33;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_50,(v10 *)"{} is not a valid HEX string; there is non-HEX char",fmt_00,
                   args_00);
        __return_storage_ptr__->mCode = kInvalidArgs;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
        goto LAB_0017c938;
      }
      uVar3 = Hex(cVar1);
      bVar4 = Hex((aHexStr->_M_dataplus)._M_p[uVar9 + 1]);
      local_88.types_[0]._0_1_ = bVar4 | uVar3 << 4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (aBuf,(uchar *)&local_88);
      uVar6 = aHexStr->_M_string_length;
    }
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_88.types_[0] = string_type;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "{} is not a valid HEX string; must have even length";
    local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_88.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar8 = "{} is not a valid HEX string; must have even length";
    write.handler_ = &local_88;
    local_88.context_.types_ = local_88.types_;
    while (pcVar8 != "") {
      cVar1 = *pcVar8;
      pcVar7 = pcVar8;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar8,"");
          goto LAB_0017c818;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar8,pcVar7);
      pcVar8 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar7,"",&local_88);
    }
LAB_0017c818:
    local_88._0_8_ = (aHexStr->_M_dataplus)._M_p;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aHexStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x33;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"{} is not a valid HEX string; must have even length",fmt,args);
    __return_storage_ptr__->mCode = kInvalidArgs;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
LAB_0017c938:
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Hex(ByteArray &aBuf, const std::string &aHexStr)
{
    if (aHexStr.size() % 2 != 0)
    {
        return ERROR_INVALID_ARGS("{} is not a valid HEX string; must have even length", aHexStr);
    }

    for (size_t i = 0; i < aHexStr.size(); i += 2)
    {
        if (!isxdigit(aHexStr[i]) || !isxdigit(aHexStr[i + 1]))
        {
            return ERROR_INVALID_ARGS("{} is not a valid HEX string; there is non-HEX char", aHexStr);
        }
        aBuf.push_back((Hex(aHexStr[i]) << 4) | Hex(aHexStr[i + 1]));
    }
    return ERROR_NONE;
}